

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::MkdirCommand::executeExternalCommand
          (MkdirCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessResult __args;
  ProcessResult __args_00;
  bool bVar1;
  int iVar2;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  const_reference ppBVar3;
  FileSystem *pFVar4;
  BuildSystemImpl *this_01;
  BuildSystemDelegate *pBVar5;
  undefined8 uVar6;
  function<void_(llbuild::basic::ProcessResult)> *pfVar7;
  void *extraout_RDX;
  TaskInterface ti_00;
  ProcessResult local_160;
  ProcessResult local_138;
  StringRef local_110;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined8 local_a0;
  MkdirCommand *local_90;
  void *local_88;
  StringRef local_80;
  string local_70;
  value_type local_50;
  value_type output;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  MkdirCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (MkdirCommand *)ti.impl;
  output = (value_type)completionFn;
  completionFn_local = (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)context;
  context_local = (QueueJobContext *)system;
  system_local = (BuildSystem *)this;
  this_00 = llbuild::buildsystem::Command::getOutputs((Command *)this);
  ppBVar3 = std::
            vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ::operator[](this_00,0);
  local_50 = *ppBVar3;
  pFVar4 = llbuild::buildsystem::BuildSystem::getFileSystem((BuildSystem *)context_local);
  local_80 = llbuild::buildsystem::Node::getName(&local_50->super_Node);
  llvm::StringRef::operator_cast_to_string(&local_70,&local_80);
  iVar2 = (*pFVar4->_vptr_FileSystem[3])();
  std::__cxx11::string::~string((string *)&local_70);
  if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
    bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                      (completionFn);
    if (bVar1) {
      pfVar7 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                         (completionFn);
      llbuild::basic::ProcessResult::ProcessResult(&local_160,Succeeded,-1,-1,0,0,0);
      __args_00.pid = local_160.pid;
      __args_00._12_4_ = local_160._12_4_;
      __args_00.status = local_160.status;
      __args_00.exitCode = local_160.exitCode;
      __args_00.utime = local_160.utime;
      __args_00.stime = local_160.stime;
      __args_00.maxrss = local_160.maxrss;
      std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar7,__args_00);
    }
  }
  else {
    local_90 = this_local;
    local_88 = ti_local.impl;
    ti_00.ctx = extraout_RDX;
    ti_00.impl = ti_local.impl;
    this_01 = getBuildSystem((anon_unknown_dwarf_26382a *)this_local,ti_00);
    pBVar5 = BuildSystemImpl::getDelegate(this_01);
    local_110 = llbuild::buildsystem::Node::getName(&local_50->super_Node);
    llvm::StringRef::str_abi_cxx11_(&local_100,&local_110);
    std::operator+(&local_e0,"unable to create directory \'",&local_100);
    std::operator+(&local_c0,&local_e0,"\'");
    ti_local.ctx = &local_c0;
    local_a0 = std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::length();
    (*pBVar5->_vptr_BuildSystemDelegate[0xb])(pBVar5,this,local_a0,uVar6);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                      (completionFn);
    if (bVar1) {
      pfVar7 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                         (completionFn);
      llbuild::basic::ProcessResult::ProcessResult(&local_138,Failed,-1,-1,0,0,0);
      __args.pid = local_138.pid;
      __args._12_4_ = local_138._12_4_;
      __args.status = local_138.status;
      __args.exitCode = local_138.exitCode;
      __args.utime = local_138.utime;
      __args.stime = local_138.stime;
      __args.maxrss = local_138.maxrss;
      std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar7,__args);
    }
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem& system,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    auto output = getOutputs()[0];
    if (!system.getFileSystem().createDirectories(
            output->getName())) {
      getBuildSystem(ti).getDelegate().commandHadError(this,
                     "unable to create directory '" + output->getName().str() + "'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (completionFn.hasValue())
      completionFn.getValue()(ProcessStatus::Succeeded);
  }